

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

GLuint deqp::gls::MultiTextureSamplerTest::createTexture3D(Functions *gl,int id)

{
  glTexImage3DFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PixelBufferAccess *pPVar7;
  void *pvVar8;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  TextureFormat local_78;
  undefined1 local_70 [8];
  Texture3D refTexture;
  GLuint texture;
  int id_local;
  Functions *gl_local;
  
  refTexture.m_view.m_levels._0_4_ = 0xffffffff;
  refTexture.m_view.m_levels._4_4_ = id;
  tcu::TextureFormat::TextureFormat(&local_78,RGBA,UNORM_INT8);
  tcu::Texture3D::Texture3D((Texture3D *)local_70,&local_78,0x20,0x20,0x20);
  tcu::Texture3D::allocLevel((Texture3D *)local_70,0);
  (*gl->genTextures)(1,(GLuint *)&refTexture.m_view.m_levels);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x39b);
  if (refTexture.m_view.m_levels._4_4_ == 0) {
    pPVar7 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_70,0);
    tcu::Vector<float,_4>::Vector(&local_94,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_a4,1.0,1.0,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar7,&local_94,&local_a4);
  }
  else if (refTexture.m_view.m_levels._4_4_ == 1) {
    pPVar7 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_70,0);
    tcu::Vector<float,_4>::Vector(&local_b4,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_c4,0.5,0.5,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar7,&local_b4,&local_c4);
  }
  (*gl->bindTexture)(0x806f,(GLuint)refTexture.m_view.m_levels);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_3D, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ac);
  p_Var1 = gl->texImage3D;
  iVar4 = tcu::Texture3D::getWidth((Texture3D *)local_70);
  iVar5 = tcu::Texture3D::getHeight((Texture3D *)local_70);
  iVar6 = tcu::Texture3D::getDepth((Texture3D *)local_70);
  pPVar7 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_70,0);
  pvVar8 = tcu::PixelBufferAccess::getDataPtr(pPVar7);
  (*p_Var1)(0x806f,0,0x8058,iVar4,iVar5,iVar6,0,0x1908,0x1401,pvVar8);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3af);
  (*gl->generateMipmap)(0x806f);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenerateMipmap(GL_TEXTURE_3D)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3b2);
  (*gl->bindTexture)(0x806f,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_3D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3b5);
  GVar2 = (GLuint)refTexture.m_view.m_levels;
  tcu::Texture3D::~Texture3D((Texture3D *)local_70);
  return GVar2;
}

Assistant:

GLuint MultiTextureSamplerTest::createTexture3D (const glw::Functions& gl, int id)
{
	GLuint			texture		= (GLuint)-1;
	tcu::Texture3D	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEXTURE3D_WIDTH, TEXTURE3D_HEIGHT, TEXTURE3D_DEPTH);

	refTexture.allocLevel(0);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_3D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_3D, texture)");

	gl.texImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())");

	gl.generateMipmap(GL_TEXTURE_3D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_3D)");

	gl.bindTexture(GL_TEXTURE_3D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_3D, 0)");

	return texture;
}